

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall wasm::TypeUpdater::noteBreakChange(TypeUpdater *this,Name name,int change,Type type)

{
  bool bVar1;
  pointer ppVar2;
  BasicType local_54;
  Block *local_50;
  Block *block;
  BlockInfo *info;
  _Self local_38;
  iterator iter;
  int change_local;
  TypeUpdater *this_local;
  Type type_local;
  Name name_local;
  
  type_local.id = name.super_IString.str._M_len;
  iter._M_node._4_4_ = change;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
       ::find(&this->blockInfos,(key_type *)&type_local);
  info = (BlockInfo *)
         std::
         map<wasm::Name,_wasm::TypeUpdater::BlockInfo,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>_>
         ::end(&this->blockInfos);
  bVar1 = std::operator==(&local_38,(_Self *)&info);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::TypeUpdater::BlockInfo>_>::
             operator->(&local_38);
    block = (Block *)&ppVar2->second;
    (ppVar2->second).numBreaks = iter._M_node._4_4_ + (ppVar2->second).numBreaks;
    if ((ppVar2->second).numBreaks < 0) {
      __assert_fail("info.numBreaks >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.h"
                    ,0xbd,"void wasm::TypeUpdater::noteBreakChange(Name, int, Type)");
    }
    local_50 = ((BlockInfo *)block)->block;
    if (local_50 != (Block *)0x0) {
      if ((ppVar2->second).numBreaks == 0) {
        makeBlockUnreachableIfNoFallThrough(this,local_50);
      }
      else if ((iter._M_node._4_4_ == 1) && ((ppVar2->second).numBreaks == 1)) {
        local_54 = unreachable;
        bVar1 = wasm::Type::operator!=
                          (&(local_50->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type,&local_54);
        if (!bVar1) {
          changeTypeTo(this,(Expression *)local_50,type);
        }
      }
    }
  }
  return;
}

Assistant:

void noteBreakChange(Name name, int change, Type type) {
    auto iter = blockInfos.find(name);
    if (iter == blockInfos.end()) {
      return; // we can ignore breaks to loops
    }
    auto& info = iter->second;
    info.numBreaks += change;
    assert(info.numBreaks >= 0);
    auto* block = info.block;
    if (block) { // if to a loop, can ignore
      if (info.numBreaks == 0) {
        // dropped to 0! the block may now be unreachable. that
        // requires that it doesn't have a fallthrough
        makeBlockUnreachableIfNoFallThrough(block);
      } else if (change == 1 && info.numBreaks == 1) {
        // bumped to 1! the block may now be reachable
        if (block->type != Type::unreachable) {
          return; // was already reachable, had a fallthrough
        }
        changeTypeTo(block, type);
      }
    }
  }